

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O3

ImportStatus try_path(string *dir,string *rel,string *content,string *found_here,string *err_msg)

{
  pointer pcVar1;
  int *piVar2;
  char *__s;
  char *pcVar3;
  ImportStatus IVar4;
  undefined8 in_R9;
  string abs_path;
  ifstream f;
  undefined1 *local_268;
  long local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  undefined8 local_248;
  undefined4 uStack_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  int aiStack_218 [50];
  undefined8 auStack_150 [36];
  
  local_260 = 0;
  local_258 = 0;
  local_268 = &local_258;
  if (rel->_M_string_length == 0) {
    pcVar3 = "the empty string is not a valid filename";
  }
  else {
    if (*(rel->_M_dataplus)._M_p == '/') {
      std::__cxx11::string::_M_assign((string *)&local_268);
    }
    else {
      std::operator+(&local_238,dir,rel);
      std::__cxx11::string::operator=((string *)&local_268,(string *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_268[local_260 + -1] != '/') {
      std::ifstream::ifstream(&local_238);
      std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_268);
      IVar4 = IMPORT_STATUS_FILE_NOT_FOUND;
      if (*(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) == 0) {
        pcVar1 = (content->_M_dataplus)._M_p;
        local_248 = 0;
        uStack_240 = 0xffffffff;
        std::__cxx11::string::
        _M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
                  ((string *)content,pcVar1,pcVar1 + content->_M_string_length,
                   *(undefined8 *)
                    ((long)auStack_150 + *(long *)(local_238._M_dataplus._M_p + -0x18)),0xffffffff,
                   in_R9,0,0xffffffff);
        if (*(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) == 0) {
          IVar4 = IMPORT_STATUS_OK;
          std::__cxx11::string::_M_assign((string *)found_here);
        }
        else {
          piVar2 = __errno_location();
          __s = strerror(*piVar2);
          pcVar3 = (char *)err_msg->_M_string_length;
          strlen(__s);
          IVar4 = IMPORT_STATUS_IO_ERROR;
          std::__cxx11::string::_M_replace((ulong)err_msg,0,pcVar3,(ulong)__s);
        }
      }
      std::ifstream::~ifstream(&local_238);
      goto LAB_0019870b;
    }
    pcVar3 = "attempted to import a directory";
  }
  IVar4 = IMPORT_STATUS_IO_ERROR;
  std::__cxx11::string::_M_replace((ulong)err_msg,0,(char *)err_msg->_M_string_length,(ulong)pcVar3)
  ;
LAB_0019870b:
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
  }
  return IVar4;
}

Assistant:

static enum ImportStatus try_path(const std::string &dir, const std::string &rel,
                                  std::string &content, std::string &found_here,
                                  std::string &err_msg)
{
    std::string abs_path;
    if (rel.length() == 0) {
        err_msg = "the empty string is not a valid filename";
        return IMPORT_STATUS_IO_ERROR;
    }
    // It is possible that rel is actually absolute.
    if (rel[0] == '/') {
        abs_path = rel;
    } else {
        abs_path = dir + rel;
    }

    if (abs_path[abs_path.length() - 1] == '/') {
        err_msg = "attempted to import a directory";
        return IMPORT_STATUS_IO_ERROR;
    }

    std::ifstream f;
    f.open(abs_path.c_str());
    if (!f.good())
        return IMPORT_STATUS_FILE_NOT_FOUND;
    try {
        content.assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());
    } catch (const std::ios_base::failure &io_err) {
        err_msg = io_err.what();
        return IMPORT_STATUS_IO_ERROR;
    }
    if (!f.good()) {
        err_msg = strerror(errno);
        return IMPORT_STATUS_IO_ERROR;
    }

    found_here = abs_path;

    return IMPORT_STATUS_OK;
}